

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSetItemLite
          (ExtensionSet *this,CodedInputStream *input,ExtensionFinder *extension_finder,
          FieldSkipper *field_skipper)

{
  byte *pbVar1;
  char cVar2;
  bool bVar3;
  uint first_byte_or_zero;
  int iVar4;
  uint8 *buffer;
  undefined4 type_id_00;
  ExtensionSet *local_c0;
  ExtensionFinder *local_b8;
  FieldSkipper *local_b0;
  CodedInputStream local_a8;
  size_type *local_58;
  string message_data;
  uint32 type_id;
  
  local_58 = &message_data._M_string_length;
  message_data._M_dataplus._M_p = (pointer)0x0;
  message_data._M_string_length._0_1_ = 0;
  type_id_00 = 0;
  local_c0 = this;
  local_b8 = extension_finder;
  local_b0 = field_skipper;
LAB_00149d72:
  do {
    pbVar1 = input->buffer_;
    if (pbVar1 < input->buffer_end_) {
      first_byte_or_zero = (uint)*pbVar1;
      if ((char)*pbVar1 < '\0') goto LAB_00149d8c;
      input->buffer_ = pbVar1 + 1;
    }
    else {
      first_byte_or_zero = 0;
LAB_00149d8c:
      first_byte_or_zero = io::CodedInputStream::ReadTagFallback(input,first_byte_or_zero);
    }
    if (first_byte_or_zero != 0x1a) {
      if (first_byte_or_zero != 0) {
        if (first_byte_or_zero == 0xc) {
          type_id_00 = 1;
          goto LAB_00149f02;
        }
        if (first_byte_or_zero != 0x10) {
          iVar4 = (*field_skipper->_vptr_FieldSkipper[2])
                            (field_skipper,input,(ulong)first_byte_or_zero);
          cVar2 = (char)iVar4;
          goto LAB_00149dd8;
        }
        bVar3 = io::CodedInputStream::ReadVarint32
                          (input,(uint32 *)(message_data.field_2._M_local_buf + 0xc));
        type_id_00 = message_data.field_2._12_4_;
        if (bVar3) {
          if (message_data._M_dataplus._M_p == (pointer)0x0) goto LAB_00149d72;
          local_a8.buffer_ = (uint8 *)local_58;
          local_a8.total_bytes_read_ = (int)message_data._M_dataplus._M_p;
          local_a8.buffer_end_ = (uint8 *)((long)local_58 + (long)local_a8.total_bytes_read_);
          local_a8.input_ = (ZeroCopyInputStream *)0x0;
          local_a8.legitimate_message_end_ = false;
          local_a8.aliasing_enabled_ = false;
          local_a8.overflow_bytes_ = 0;
          local_a8.last_tag_ = 0;
          local_a8.buffer_size_after_limit_ = 0;
          local_a8.total_bytes_limit_ = 0x7fffffff;
          local_a8.extension_pool_ = (DescriptorPool *)0x0;
          local_a8.extension_factory_ = (MessageFactory *)0x0;
          local_a8.recursion_budget_ = input->recursion_budget_;
          local_a8.current_limit_ = local_a8.total_bytes_read_;
          local_a8.recursion_limit_ = local_a8.recursion_budget_;
          bVar3 = ParseMessageSetItemLite(google::protobuf::io::CodedInputStream*,google::protobuf::
                  internal::ExtensionFinder*,google::protobuf::internal::FieldSkipper*)::MSLite::
                  ParseField(int,google::protobuf::io::CodedInputStream__
                            (&local_c0,message_data.field_2._12_4_,&local_a8);
          if (bVar3) {
            message_data._M_dataplus._M_p = (pointer)0x0;
            *(undefined1 *)local_58 = 0;
            io::CodedInputStream::~CodedInputStream(&local_a8);
            goto LAB_00149d72;
          }
          io::CodedInputStream::~CodedInputStream(&local_a8);
        }
      }
LAB_00149eff:
      type_id_00 = 0;
      goto LAB_00149f02;
    }
    if (type_id_00 == 0) {
      bVar3 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&local_a8);
      if ((!bVar3) || ((int)(uint)local_a8.buffer_ < 0)) goto LAB_00149eff;
      iVar4 = 0x1f;
      if (((uint)local_a8.buffer_ | 1) != 0) {
        for (; ((uint)local_a8.buffer_ | 1) >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      std::__cxx11::string::resize((ulong)&local_58);
      buffer = io::CodedOutputStream::WriteVarint32ToArray((uint)local_a8.buffer_,(uint8 *)local_58)
      ;
      bVar3 = io::CodedInputStream::ReadRaw(input,buffer,(uint)local_a8.buffer_);
      type_id_00 = 0;
      if (!bVar3) {
LAB_00149f02:
        std::__cxx11::string::~string((string *)&local_58);
        return SUB41(type_id_00,0);
      }
    }
    else {
      cVar2 = ParseMessageSetItemLite(google::protobuf::io::CodedInputStream*,google::protobuf::
              internal::ExtensionFinder*,google::protobuf::internal::FieldSkipper*)::MSLite::
              ParseField(int,google::protobuf::io::CodedInputStream__(&local_c0,type_id_00,input);
LAB_00149dd8:
      if (cVar2 == '\0') goto LAB_00149eff;
    }
  } while( true );
}

Assistant:

bool ExtensionSet::ParseMessageSetItemLite(io::CodedInputStream* input,
                                           ExtensionFinder* extension_finder,
                                           FieldSkipper* field_skipper) {
  struct MSLite {
    bool ParseField(int type_id, io::CodedInputStream* input) {
      return me->ParseField(
          WireFormatLite::WIRETYPE_LENGTH_DELIMITED + 8 * type_id, input,
          extension_finder, field_skipper);
    }

    bool SkipField(uint32 tag, io::CodedInputStream* input) {
      return field_skipper->SkipField(input, tag);
    }

    ExtensionSet* me;
    ExtensionFinder* extension_finder;
    FieldSkipper* field_skipper;
  };

  return ParseMessageSetItemImpl(input,
                                 MSLite{this, extension_finder, field_skipper});
}